

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace.cpp
# Opt level: O0

void anon_unknown.dwarf_6c987::write_function
               (void *context,Pointer location,Pointer remapped_location,uint32_t value,
               int num_bytes,MemoryAccessType reason)

{
  int iVar1;
  Event *this;
  Event *event;
  MemoryAccessType reason_local;
  int num_bytes_local;
  uint32_t value_local;
  Pointer remapped_location_local;
  Pointer location_local;
  void *context_local;
  
  this = snestistics::BlockVector<(anonymous_namespace)::Event,_174762>::last
                   ((BlockVector<(anonymous_namespace)::Event,_174762> *)context);
  if ((reason == RANDOM) || (reason == STACK_RELATIVE)) {
    if (this->data_pointer == 0xffffffff) {
      this->data_pointer = remapped_location;
      Event::set_data_size(this,num_bytes);
    }
    else {
      if (this->data_pointer != remapped_location) {
        __assert_fail("event.data_pointer == remapped_location",
                      "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/rewind.cpp"
                      ,0x2fa,
                      "void (anonymous namespace)::write_function(void *, Pointer, Pointer, uint32_t, int, MemoryAccessType)"
                     );
      }
      iVar1 = Event::data_size(this);
      if (iVar1 != num_bytes) {
        __assert_fail("event.data_size() == num_bytes",
                      "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/rewind.cpp"
                      ,0x2fb,
                      "void (anonymous namespace)::write_function(void *, Pointer, Pointer, uint32_t, int, MemoryAccessType)"
                     );
      }
    }
    Event::set_bit(this,BIT_HAD_WRITE_FLAG);
  }
  return;
}

Assistant:

void write_function(void* context, Pointer location, Pointer remapped_location, uint32_t value, int num_bytes, MemoryAccessType reason) {
	if (reason != MemoryAccessType::RANDOM && reason != MemoryAccessType::FETCH_INDIRECT)
		return;
	CallbackContext &m = *(CallbackContext*)context;
	snestistics::Trace::MemoryAccess a;
	for (int k = 0; k < num_bytes; ++k) {
		a.adress = remapped_location + k;
		a.pc = m.current_pc | 0x80000000; // Indicates write
		m.accesses.insert(a);
	}
}